

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> * __thiscall
apngasm::APNGAsm::fileToFrames(APNGAsm *this,string *filePath,uint delayNum,uint delayDen)

{
  uchar *puVar1;
  undefined1 auVar2 [16];
  bool hasInfo_00;
  bool skipFirst_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_type sVar8;
  char *__filename;
  size_t sVar9;
  ulong uVar10;
  uchar **rows_src;
  size_type sVar11;
  reference pvVar12;
  undefined1 local_d18 [8];
  APNGFrame frameNext;
  APNGFrame frameCur;
  APNGFrame frameRaw;
  bool hasInfo;
  bool skipFirst;
  bool isAnimated;
  uint imagesize;
  uint rowbytes;
  uint bop;
  uint dop;
  uint delay_den;
  uint delay_num;
  uint y0;
  uint x0;
  uint h0;
  uint w0;
  uchar sig [8];
  FILE *f;
  CHUNK chunk;
  uint h;
  uint w;
  uint id;
  uint j;
  uint i;
  int oldFrameCount;
  uint delayDen_local;
  uint delayNum_local;
  string *filePath_local;
  APNGAsm *this_local;
  
  sVar8 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size(&this->_frames)
  ;
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(filePath);
  sig = (uchar  [8])fopen(__filename,"rb");
  if (sig != (uchar  [8])0x0) {
    bVar3 = false;
    skipFirst_00 = false;
    hasInfo_00 = false;
    sVar9 = fread(&h0,1,8,(FILE *)sig);
    if ((((sVar9 == 8) && (iVar4 = png_sig_cmp(&h0,0,8), iVar4 == 0)) &&
        (uVar5 = read_chunk(this,(FILE *)sig,&this->_chunkIHDR), uVar5 == 0x52444849)) &&
       ((this->_chunkIHDR).size == 0x19)) {
      x0 = (uint)(this->_chunkIHDR).p[8] * 0x1000000 + (uint)(this->_chunkIHDR).p[9] * 0x10000 +
           (uint)(this->_chunkIHDR).p[10] * 0x100 + (uint)(this->_chunkIHDR).p[0xb];
      y0 = (uint)(this->_chunkIHDR).p[0xc] * 0x1000000 + (uint)(this->_chunkIHDR).p[0xd] * 0x10000 +
           (uint)(this->_chunkIHDR).p[0xe] * 0x100 + (uint)(this->_chunkIHDR).p[0xf];
      delay_num = 0;
      delay_den = 0;
      rowbytes = 0;
      imagesize = 0;
      iVar4 = x0 * 4;
      uVar5 = y0 * iVar4;
      chunk.p._0_4_ = y0;
      chunk.p._4_4_ = x0;
      APNGFrame::APNGFrame((APNGFrame *)&frameCur._rows);
      APNGFrame::APNGFrame((APNGFrame *)&frameNext._rows);
      APNGFrame::APNGFrame((APNGFrame *)local_d18);
      frameCur._rows = (uchar **)operator_new__((ulong)uVar5);
      auVar2 = ZEXT416((uint)chunk.p) * (undefined1  [16])0x8 * ZEXT816(8);
      uVar10 = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      rows_src = (uchar **)operator_new__(uVar10);
      for (w = 0; w < (uint)chunk.p; w = w + 1) {
        rows_src[w] = (uchar *)((long)frameCur._rows + (ulong)(w * iVar4));
      }
      frameCur._pixels._0_4_ = chunk.p._4_4_;
      frameCur._pixels._4_4_ = (uint)chunk.p;
      frameCur._width._0_1_ = 6;
      frameNext._rows = (uchar **)operator_new__((ulong)uVar5);
      auVar2 = ZEXT416((uint)chunk.p) * (undefined1  [16])0x8 * ZEXT816(8);
      uVar10 = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      frameCur._1056_8_ = operator_new__(uVar10);
      for (w = 0; w < (uint)chunk.p; w = w + 1) {
        *(ulong *)(frameCur._1056_8_ + (ulong)w * 8) = (long)frameNext._rows + (ulong)(w * iVar4);
      }
      processing_start(this,&frameCur._rows,false);
      bop = delayDen;
      dop = delayNum;
      while (iVar6 = feof((FILE *)sig), iVar6 == 0) {
        uVar7 = read_chunk(this,(FILE *)sig,(CHUNK *)&f);
        if (((uVar7 != 0x4c546361) || (hasInfo_00 != false)) || (bVar3)) {
          if ((uVar7 == 0x4c546366) && ((hasInfo_00 == false || (bVar3)))) {
            if (hasInfo_00 != false) {
              iVar6 = processing_finish(this);
              if (iVar6 != 0) {
                if (frameCur._1056_8_ != 0) {
                  operator_delete__((void *)frameCur._1056_8_);
                }
                if (frameNext._rows != (uchar **)0x0) {
                  operator_delete__(frameNext._rows);
                }
                if (chunk._0_8_ != 0) {
                  operator_delete__((void *)chunk._0_8_);
                }
                break;
              }
              local_d18 = (undefined1  [8])operator_new__((ulong)uVar5);
              auVar2 = ZEXT416((uint)chunk.p) * (undefined1  [16])0x8 * ZEXT816(8);
              uVar10 = auVar2._0_8_;
              if (auVar2._8_8_ != 0) {
                uVar10 = 0xffffffffffffffff;
              }
              frameNext._1056_8_ = operator_new__(uVar10);
              for (w = 0; w < (uint)chunk.p; w = w + 1) {
                *(ulong *)(frameNext._1056_8_ + (ulong)w * 8) = (long)local_d18 + (ulong)(w * iVar4)
                ;
              }
              if (rowbytes == 2) {
                memcpy((void *)local_d18,frameNext._rows,(ulong)uVar5);
              }
              compose_frame(this,(uchar **)frameCur._1056_8_,rows_src,(uchar)imagesize,delay_num,
                            delay_den,x0,y0);
              frameCur._paletteSize = dop;
              frameCur._transparencySize = bop;
              std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::push_back
                        (&this->_frames,(value_type *)&frameNext._rows);
              if ((rowbytes != 2) &&
                 (memcpy((void *)local_d18,frameNext._rows,(ulong)uVar5), rowbytes == 1)) {
                for (w = 0; w < y0; w = w + 1) {
                  memset((void *)(*(long *)(frameNext._1056_8_ + (ulong)(delay_den + w) * 8) +
                                 (ulong)(delay_num << 2)),0,(ulong)(x0 << 2));
                }
              }
              frameNext._rows = (uchar **)local_d18;
              frameCur._delayDen = frameNext._delayDen;
              frameCur._1060_4_ = frameNext._1060_4_;
            }
            x0 = (uint)*(byte *)(chunk._0_8_ + 0xc) * 0x1000000 +
                 (uint)*(byte *)(chunk._0_8_ + 0xd) * 0x10000 +
                 (uint)*(byte *)(chunk._0_8_ + 0xe) * 0x100 + (uint)*(byte *)(chunk._0_8_ + 0xf);
            y0 = (uint)*(byte *)(chunk._0_8_ + 0x10) * 0x1000000 +
                 (uint)*(byte *)(chunk._0_8_ + 0x11) * 0x10000 +
                 (uint)*(byte *)(chunk._0_8_ + 0x12) * 0x100 + (uint)*(byte *)(chunk._0_8_ + 0x13);
            delay_num = (uint)*(byte *)(chunk._0_8_ + 0x14) * 0x1000000 +
                        (uint)*(byte *)(chunk._0_8_ + 0x15) * 0x10000 +
                        (uint)*(byte *)(chunk._0_8_ + 0x16) * 0x100 +
                        (uint)*(byte *)(chunk._0_8_ + 0x17);
            delay_den = (uint)*(byte *)(chunk._0_8_ + 0x18) * 0x1000000 +
                        (uint)*(byte *)(chunk._0_8_ + 0x19) * 0x10000 +
                        (uint)*(byte *)(chunk._0_8_ + 0x1a) * 0x100 +
                        (uint)*(byte *)(chunk._0_8_ + 0x1b);
            dop = (uint)*(byte *)(chunk._0_8_ + 0x1c) * 0x100 + (uint)*(byte *)(chunk._0_8_ + 0x1d)
                  & 0xffff;
            bop = (uint)*(byte *)(chunk._0_8_ + 0x1e) * 0x100 + (uint)*(byte *)(chunk._0_8_ + 0x1f)
                  & 0xffff;
            rowbytes = (uint)*(byte *)(chunk._0_8_ + 0x20);
            imagesize = (uint)*(byte *)(chunk._0_8_ + 0x21);
            if (hasInfo_00 == false) {
              skipFirst_00 = false;
            }
            else {
              *(undefined8 *)((this->_chunkIHDR).p + 8) = *(undefined8 *)(chunk._0_8_ + 0xc);
              processing_start(this,&frameCur._rows,hasInfo_00);
            }
            sVar11 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                               (&this->_frames);
            if ((sVar11 == (long)(int)(uint)(skipFirst_00 != false)) &&
               (imagesize = 0, rowbytes == 2)) {
              rowbytes = 1;
            }
            goto LAB_001c79da;
          }
          if (uVar7 == 0x54414449) {
            hasInfo_00 = true;
            processing_data(this,(uchar *)chunk._0_8_,(uint)f);
            goto LAB_001c79da;
          }
          if ((uVar7 == 0x54416466) && (bVar3)) {
            png_save_uint_32(chunk._0_8_ + 4,(uint)f - 0x10);
            *(undefined4 *)(chunk._0_8_ + 8) = 0x54414449;
            processing_data(this,(uchar *)(chunk._0_8_ + 4),(uint)f - 4);
            goto LAB_001c79da;
          }
          if (uVar7 == 0x444e4549) {
            if ((hasInfo_00 == false) || (iVar4 = processing_finish(this), iVar4 != 0)) {
              if (frameCur._1056_8_ != 0) {
                operator_delete__((void *)frameCur._1056_8_);
              }
              if (frameNext._rows != (uchar **)0x0) {
                operator_delete__(frameNext._rows);
              }
            }
            else {
              compose_frame(this,(uchar **)frameCur._1056_8_,rows_src,(uchar)imagesize,delay_num,
                            delay_den,x0,y0);
              frameCur._paletteSize = dop;
              frameCur._transparencySize = bop;
              std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::push_back
                        (&this->_frames,(value_type *)&frameNext._rows);
            }
            if (chunk._0_8_ != 0) {
              operator_delete__((void *)chunk._0_8_);
            }
            break;
          }
          if (((((((*(byte *)(chunk._0_8_ + 4) < 0x41) || (0x7a < *(byte *)(chunk._0_8_ + 4))) ||
                 ((0x5a < *(byte *)(chunk._0_8_ + 4) && (*(byte *)(chunk._0_8_ + 4) < 0x61)))) ||
                ((*(byte *)(chunk._0_8_ + 5) < 0x41 || (0x7a < *(byte *)(chunk._0_8_ + 5))))) ||
               ((0x5a < *(byte *)(chunk._0_8_ + 5) && (*(byte *)(chunk._0_8_ + 5) < 0x61)))) ||
              ((((*(byte *)(chunk._0_8_ + 6) < 0x41 || (0x7a < *(byte *)(chunk._0_8_ + 6))) ||
                ((0x5a < *(byte *)(chunk._0_8_ + 6) && (*(byte *)(chunk._0_8_ + 6) < 0x61)))) ||
               ((*(byte *)(chunk._0_8_ + 7) < 0x41 || (0x7a < *(byte *)(chunk._0_8_ + 7))))))) ||
             ((0x5a < *(byte *)(chunk._0_8_ + 7) && (*(byte *)(chunk._0_8_ + 7) < 0x61)))) {
            if (chunk._0_8_ != 0) {
              operator_delete__((void *)chunk._0_8_);
            }
            break;
          }
          if (hasInfo_00 != false) goto LAB_001c79da;
          processing_data(this,(uchar *)chunk._0_8_,(uint)f);
          std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::push_back
                    (&this->_info_chunks,(value_type *)&f);
        }
        else {
          bVar3 = true;
          skipFirst_00 = true;
          this->_loops = (uint)*(byte *)(chunk._0_8_ + 0xc) * 0x1000000 +
                         (uint)*(byte *)(chunk._0_8_ + 0xd) * 0x10000 +
                         (uint)*(byte *)(chunk._0_8_ + 0xe) * 0x100 +
                         (uint)*(byte *)(chunk._0_8_ + 0xf);
LAB_001c79da:
          if (chunk._0_8_ != 0) {
            operator_delete__((void *)chunk._0_8_);
          }
        }
      }
      if (rows_src != (uchar **)0x0) {
        operator_delete__(rows_src);
      }
      if (frameCur._rows != (uchar **)0x0) {
        operator_delete__(frameCur._rows);
      }
    }
    fclose((FILE *)sig);
    sVar11 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                       (&this->_frames);
    if (1 < sVar11 - (long)(int)sVar8) {
      setSkipFirst(this,skipFirst_00);
    }
    for (id = 0; sVar8 = std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::size
                                   (&this->_info_chunks), id < sVar8; id = id + 1) {
      pvVar12 = std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::operator[]
                          (&this->_info_chunks,(ulong)id);
      if (pvVar12->p != (uchar *)0x0) {
        operator_delete__(pvVar12->p);
      }
    }
    std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::clear(&this->_info_chunks);
    puVar1 = (this->_chunkIHDR).p;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
  }
  return &this->_frames;
}

Assistant:

const std::vector<APNGFrame>& APNGAsm::fileToFrames(const std::string &filePath, unsigned int delayNum, unsigned int delayDen)
  {
    const int oldFrameCount = _frames.size();
    unsigned int   i, j, id;
    unsigned int   w, h;
    CHUNK chunk;

    FILE * f;
    if ((f = fopen(filePath.c_str(), "rb")) != 0)
    {
      unsigned char sig[8];
      unsigned int  w0, h0, x0, y0;
      unsigned int  delay_num, delay_den, dop, bop, rowbytes, imagesize;
      bool          isAnimated = false;
      bool          skipFirst = false;
      bool          hasInfo = false;

      if (fread(sig, 1, 8, f) == 8 && png_sig_cmp(sig, 0, 8) == 0)
      {
        id = read_chunk(f, &_chunkIHDR);

        if (id == id_IHDR && _chunkIHDR.size == 25)
        {
          w0 = w = png_get_uint_32(_chunkIHDR.p + 8);
          h0 = h = png_get_uint_32(_chunkIHDR.p + 12);
          x0 = 0;
          y0 = 0;
          delay_num = delayNum;
          delay_den = delayDen;
          dop = 0;
          bop = 0;
          rowbytes = w * 4;
          imagesize = h * rowbytes;

          APNGFrame frameRaw;
          APNGFrame frameCur;
          APNGFrame frameNext;

          frameRaw._pixels = new unsigned char[imagesize];
          frameRaw._rows = new png_bytep[h * sizeof(png_bytep)];
          for (j=0; j<h; ++j)
            frameRaw._rows[j] = frameRaw._pixels + j * rowbytes;

          frameCur._width = w;
          frameCur._height = h;
          frameCur._colorType = 6;
          frameCur._pixels = new unsigned char[imagesize];
          frameCur._rows = new png_bytep[h * sizeof(png_bytep)];
          for (j=0; j<h; ++j)
            frameCur._rows[j] = frameCur._pixels + j * rowbytes;

          processing_start((void *)&frameRaw, hasInfo);

          while ( !feof(f) )
          {
            id = read_chunk(f, &chunk);

            if (id == id_acTL && !hasInfo && !isAnimated)
            {
              isAnimated = true;
              skipFirst = true;
              _loops = png_get_uint_32(chunk.p + 12);
            }
            else
            if (id == id_fcTL && (!hasInfo || isAnimated))
            {
              if (hasInfo)
              {
                if (!processing_finish())
                {
                  frameNext._pixels = new unsigned char[imagesize];
                  frameNext._rows = new png_bytep[h * sizeof(png_bytep)];
                  for (j=0; j<h; ++j)
                    frameNext._rows[j] = frameNext._pixels + j * rowbytes;

                  if (dop == 2)
                    memcpy(frameNext._pixels, frameCur._pixels, imagesize);

                  compose_frame(frameCur._rows, frameRaw._rows, bop, x0, y0, w0, h0);
                  frameCur._delayNum = delay_num;
                  frameCur._delayDen = delay_den;
                  _frames.push_back(frameCur);

                  if (dop != 2)
                  {
                    memcpy(frameNext._pixels, frameCur._pixels, imagesize);
                    if (dop == 1)
                      for (j=0; j<h0; j++)
                        memset(frameNext._rows[y0 + j] + x0*4, 0, w0*4);
                  }
                  frameCur._pixels = frameNext._pixels;
                  frameCur._rows = frameNext._rows;
                }
                else
                {
                  delete[] frameCur._rows;
                  delete[] frameCur._pixels;
                  delete[] chunk.p;
                  break;
                }
              }

              // At this point the old frame is done. Let's start a new one.
              w0 = png_get_uint_32(chunk.p + 12);
              h0 = png_get_uint_32(chunk.p + 16);
              x0 = png_get_uint_32(chunk.p + 20);
              y0 = png_get_uint_32(chunk.p + 24);
              delay_num = png_get_uint_16(chunk.p + 28);
              delay_den = png_get_uint_16(chunk.p + 30);
              dop = chunk.p[32];
              bop = chunk.p[33];

              if (hasInfo)
              {
                memcpy(_chunkIHDR.p + 8, chunk.p + 12, 8);
                processing_start((void *)&frameRaw, hasInfo);
              }
              else
                skipFirst = false;

              if (_frames.size() == (skipFirst ? 1 : 0))
              {
                bop = 0;
                if (dop == 2)
                  dop = 1;
              }
            }
            else
            if (id == id_IDAT)
            {
              hasInfo = true;
              processing_data(chunk.p, chunk.size);
            }
            else
            if (id == id_fdAT && isAnimated)
            {
              png_save_uint_32(chunk.p + 4, chunk.size - 16);
              memcpy(chunk.p + 8, "IDAT", 4);
              processing_data(chunk.p + 4, chunk.size - 4);
            }
            else
            if (id == id_IEND)
            {
              if (hasInfo && !processing_finish())
              {
                compose_frame(frameCur._rows, frameRaw._rows, bop, x0, y0, w0, h0);
                frameCur._delayNum = delay_num;
                frameCur._delayDen = delay_den;
                _frames.push_back(frameCur);
              }
              else
              {
                delete[] frameCur._rows;
                delete[] frameCur._pixels;
              }
              delete[] chunk.p;
              break;
            }
            else
            if (notabc(chunk.p[4]) || notabc(chunk.p[5]) || notabc(chunk.p[6]) || notabc(chunk.p[7]))
            {
              delete[] chunk.p;
              break;
            }
            else
            if (!hasInfo)
            {
              processing_data(chunk.p, chunk.size);
              _info_chunks.push_back(chunk);
              continue;
            }
            delete[] chunk.p;
          }
          delete[] frameRaw._rows;
          delete[] frameRaw._pixels;
        }
      }
      fclose(f);

      if(_frames.size() - oldFrameCount > 1)
        setSkipFirst(skipFirst);

      for (i=0; i<_info_chunks.size(); ++i)
        delete[] _info_chunks[i].p;

      _info_chunks.clear();

      delete[] _chunkIHDR.p;
    }
    return _frames;
  }